

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

void Ssw_ManCollectPos_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vNewPos)

{
  int iVar1;
  ulong uVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  Aig_Obj_t *pObj_00;
  uint uVar8;
  uint uVar9;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                  ,0x6b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
  }
  uVar2 = *(ulong *)&pObj->field_0x18;
  if (((uVar2 & 0x20) == 0) &&
     (*(ulong *)&pObj->field_0x18 = uVar2 | 0x20, pObj->Id <= p->nSRMiterMaxId)) {
    if (((uint)uVar2 & 7) == 3) {
      iVar7 = (pObj->field_0).CioId;
      if (iVar7 < p->pFrames->nObjs[3] - p->pAig->nRegs) {
        uVar9 = vNewPos->nSize;
        if (uVar9 == vNewPos->nCap) {
          if ((int)uVar9 < 0x10) {
            if (vNewPos->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(0x40);
            }
            else {
              piVar6 = (int *)realloc(vNewPos->pArray,0x40);
            }
            vNewPos->pArray = piVar6;
            if (piVar6 == (int *)0x0) {
LAB_006ac150:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vNewPos->nCap = 0x10;
          }
          else {
            if (vNewPos->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((ulong)uVar9 * 8);
            }
            else {
              piVar6 = (int *)realloc(vNewPos->pArray,(ulong)uVar9 * 8);
            }
            vNewPos->pArray = piVar6;
            if (piVar6 == (int *)0x0) goto LAB_006ac150;
            vNewPos->nCap = uVar9 * 2;
          }
        }
        else {
          piVar6 = vNewPos->pArray;
        }
        iVar1 = vNewPos->nSize;
        vNewPos->nSize = iVar1 + 1;
        piVar6[iVar1] = iVar7 / 2;
      }
    }
    else {
      if (p->pFrames->pFanData == (int *)0x0) {
        __assert_fail("p->pFrames->pFanData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                      ,0x7b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
      }
      if ((uVar2 & 0xffffffc0) != 0) {
        uVar9 = 0xffffffff;
        uVar8 = 0;
        do {
          pAVar3 = p->pFrames;
          if (uVar8 == 0) {
            if (pAVar3->nFansAlloc <= pObj->Id) {
              __assert_fail("ObjId < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
            }
            iVar7 = pObj->Id * 5;
          }
          else {
            if (pAVar3->nFansAlloc <= (int)uVar9 / 2) {
              __assert_fail("iFan/2 < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
            }
            iVar7 = ((int)uVar9 >> 1) * 5 + (uVar9 & 1) + 3;
          }
          pVVar4 = pAVar3->vObjs;
          uVar9 = pAVar3->pFanData[iVar7];
          if (pVVar4 == (Vec_Ptr_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar5 = (int)uVar9 >> 1;
            if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pObj_00 = (Aig_Obj_t *)pVVar4->pArray[uVar5];
          }
          Ssw_ManCollectPos_rec(p,pObj_00,vNewPos);
          uVar8 = uVar8 + 1;
        } while (uVar8 < *(uint *)&pObj->field_0x18 >> 6);
      }
    }
  }
  return;
}

Assistant:

void Ssw_ManCollectPos_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vNewPos )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    if ( pObj->Id > p->nSRMiterMaxId )
        return;
    if ( Aig_ObjIsCo(pObj) )
    {
        // skip if it is a register input PO
        if ( Aig_ObjCioId(pObj) >= Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig) )
            return;
        // add the number of this constraint
        Vec_IntPush( vNewPos, Aig_ObjCioId(pObj)/2 );
        return;
    }
    // visit the fanouts
    assert( p->pFrames->pFanData != NULL );
    Aig_ObjForEachFanout( p->pFrames, pObj, pFanout, iFanout, i )
        Ssw_ManCollectPos_rec( p, pFanout, vNewPos );
}